

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::deleteRows(Highs *this,HighsInt *mask)

{
  uint dimension;
  HighsStatus HVar1;
  ulong uVar2;
  ulong uVar3;
  HighsIndexCollection index_collection;
  HighsIndexCollection local_68;
  
  clearDerivedModelProperties(this);
  dimension = (this->model_).lp_.num_row_;
  local_68.dimension_ = -1;
  local_68.is_interval_ = false;
  local_68.from_ = -1;
  local_68.to_ = -2;
  local_68.is_set_ = false;
  local_68.set_num_entries_ = -1;
  local_68.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  local_68.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  local_68.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_68._41_8_ = 0;
  create(&local_68,mask,dimension);
  deleteRowsInterface(this,&local_68);
  uVar2 = 0;
  uVar3 = (ulong)dimension;
  if ((int)dimension < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    mask[uVar2] = local_68.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar2];
  }
  HVar1 = returnFromHighs(this,kOk);
  HighsIndexCollection::~HighsIndexCollection(&local_68);
  return HVar1;
}

Assistant:

HighsStatus Highs::deleteRows(HighsInt* mask) {
  clearDerivedModelProperties();
  const HighsInt original_num_row = model_.lp_.num_row_;
  HighsIndexCollection index_collection;
  const bool create_error = create(index_collection, mask, original_num_row);
  assert(!create_error);
  (void)create_error;
  deleteRowsInterface(index_collection);
  for (HighsInt iRow = 0; iRow < original_num_row; iRow++)
    mask[iRow] = index_collection.mask_[iRow];
  return returnFromHighs(HighsStatus::kOk);
}